

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::DatePartFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *pSVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_eb1;
  LogicalType local_eb0 [24];
  LogicalType local_e98 [24];
  ScalarFunctionSet *local_e80;
  code *local_e78;
  undefined8 local_e70;
  code *local_e68;
  code *local_e60;
  code *local_e58;
  undefined8 local_e50;
  code *local_e48;
  code *local_e40;
  code *local_e38;
  undefined8 local_e30;
  code *local_e28;
  code *local_e20;
  code *local_e18;
  undefined8 local_e10;
  code *local_e08;
  code *local_e00;
  code *local_df8;
  undefined8 local_df0;
  code *local_de8;
  code *local_de0;
  LogicalType local_dd8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_dc0;
  LogicalType local_da8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d90;
  LogicalType local_d78 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d60;
  LogicalType local_d48 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d30;
  LogicalType local_d18 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d00;
  LogicalType local_ce8 [24];
  LogicalType local_cd0 [24];
  LogicalType local_cb8 [24];
  LogicalType local_ca0 [24];
  LogicalType local_c88 [24];
  ScalarFunction local_c70;
  ScalarFunction local_b48;
  ScalarFunction local_a20;
  ScalarFunction local_8f8;
  ScalarFunction local_7d0;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_e80 = in_RDI;
  duckdb::LogicalType::LogicalType(local_eb0,VARCHAR);
  duckdb::LogicalType::LogicalType(local_e98,DATE);
  __l._M_len = 2;
  __l._M_array = local_eb0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d00,__l,&local_eb1);
  duckdb::LogicalType::LogicalType(local_d18,BIGINT);
  local_df0 = 0;
  local_df8 = DatePartFunction<duckdb::date_t>;
  local_de0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_de8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_c88,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_d00,local_d18,&local_df8,DatePartBind,0,0,0,local_c88,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_c88);
  if (local_de8 != (code *)0x0) {
    (*local_de8)(&local_df8,&local_df8,3);
  }
  duckdb::LogicalType::~LogicalType(local_d18);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d00);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_eb0 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::LogicalType(local_eb0,VARCHAR);
  duckdb::LogicalType::LogicalType(local_e98,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = local_eb0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d30,__l_00,&local_eb1);
  duckdb::LogicalType::LogicalType(local_d48,BIGINT);
  local_e10 = 0;
  local_e18 = DatePartFunction<duckdb::timestamp_t>;
  local_e00 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_e08 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_ca0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_d30,local_d48,&local_e18,DatePartBind,0,0,0,local_ca0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_ca0);
  if (local_e08 != (code *)0x0) {
    (*local_e08)(&local_e18,&local_e18,3);
  }
  duckdb::LogicalType::~LogicalType(local_d48);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d30);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_eb0 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::LogicalType(local_eb0,VARCHAR);
  duckdb::LogicalType::LogicalType(local_e98,TIME);
  __l_01._M_len = 2;
  __l_01._M_array = local_eb0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d60,__l_01,&local_eb1);
  duckdb::LogicalType::LogicalType(local_d78,BIGINT);
  local_e30 = 0;
  local_e38 = DatePartFunction<duckdb::dtime_t>;
  local_e20 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_e28 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_cb8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_458,&local_d60,local_d78,&local_e38,DatePartBind,0,0,0,local_cb8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_458);
  local_458._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_458 + 0xb0U),(_Any_data *)((long)&local_458 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_cb8);
  if (local_e28 != (code *)0x0) {
    (*local_e28)(&local_e38,&local_e38,3);
  }
  duckdb::LogicalType::~LogicalType(local_d78);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d60);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_eb0 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::LogicalType(local_eb0,VARCHAR);
  duckdb::LogicalType::LogicalType(local_e98,INTERVAL);
  __l_02._M_len = 2;
  __l_02._M_array = local_eb0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d90,__l_02,&local_eb1);
  duckdb::LogicalType::LogicalType(local_da8,BIGINT);
  local_e50 = 0;
  local_e58 = DatePartFunction<duckdb::interval_t>;
  local_e40 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_e48 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_cd0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_580,&local_d90,local_da8,&local_e58,DatePartBind,0,0,0,local_cd0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_580);
  local_580._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_580 + 0xb0U),(_Any_data *)((long)&local_580 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_cd0);
  if (local_e48 != (code *)0x0) {
    (*local_e48)(&local_e58,&local_e58,3);
  }
  duckdb::LogicalType::~LogicalType(local_da8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d90);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_eb0 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::LogicalType(local_eb0,VARCHAR);
  duckdb::LogicalType::LogicalType(local_e98,TIME_TZ);
  __l_03._M_len = 2;
  __l_03._M_array = local_eb0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_dc0,__l_03,&local_eb1);
  duckdb::LogicalType::LogicalType(local_dd8,BIGINT);
  local_e70 = 0;
  local_e78 = DatePartFunction<duckdb::dtime_tz_t>;
  local_e60 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_e68 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_ce8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_6a8,&local_dc0,local_dd8,&local_e78,DatePartBind,0,0,0,local_ce8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_6a8);
  local_6a8._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_6a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_6a8 + 0xb0U),(_Any_data *)((long)&local_6a8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_ce8);
  if (local_e68 != (code *)0x0) {
    (*local_e68)(&local_e78,&local_e78,3);
  }
  duckdb::LogicalType::~LogicalType(local_dd8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_dc0);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_eb0 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::LogicalType(local_eb0,DATE);
  StructDatePart::GetFunction<duckdb::date_t>(&local_7d0,local_eb0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_7d0);
  local_7d0._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_7d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d0.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_7d0 + 0xb0U),(_Any_data *)((long)&local_7d0 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_7d0.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_eb0);
  duckdb::LogicalType::LogicalType(local_eb0,TIMESTAMP);
  StructDatePart::GetFunction<duckdb::timestamp_t>(&local_8f8,local_eb0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_8f8);
  local_8f8._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_8f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_8f8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_8f8 + 0xb0U),(_Any_data *)((long)&local_8f8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_8f8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_eb0);
  duckdb::LogicalType::LogicalType(local_eb0,TIME);
  StructDatePart::GetFunction<duckdb::dtime_t>(&local_a20,local_eb0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_a20);
  local_a20._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_a20.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a20.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a20.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a20.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_a20 + 0xb0U),(_Any_data *)((long)&local_a20 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_a20.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_eb0);
  duckdb::LogicalType::LogicalType(local_eb0,INTERVAL);
  StructDatePart::GetFunction<duckdb::interval_t>(&local_b48,local_eb0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_b48);
  local_b48._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_b48.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b48.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b48.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b48.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_b48 + 0xb0U),(_Any_data *)((long)&local_b48 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_b48.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_eb0);
  duckdb::LogicalType::LogicalType(local_eb0,TIME_TZ);
  StructDatePart::GetFunction<duckdb::dtime_tz_t>(&local_c70,local_eb0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_c70);
  local_c70._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_c70.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c70.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pSVar2 = local_e80;
  if (local_c70.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c70.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_c70 + 0xb0U),(_Any_data *)((long)&local_c70 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_c70.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_eb0);
  function = *(BaseScalarFunction **)(pSVar2 + 0x20);
  pBVar1 = *(BaseScalarFunction **)(pSVar2 + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return local_e80;
}

Assistant:

ScalarFunctionSet DatePartFun::GetFunctions() {
	ScalarFunctionSet date_part;
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::DATE}, LogicalType::BIGINT,
	                                     DatePartFunction<date_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIMESTAMP}, LogicalType::BIGINT,
	                                     DatePartFunction<timestamp_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::INTERVAL}, LogicalType::BIGINT,
	                                     DatePartFunction<interval_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME_TZ}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_tz_t>, DatePartBind));

	// struct variants
	date_part.AddFunction(StructDatePart::GetFunction<date_t>(LogicalType::DATE));
	date_part.AddFunction(StructDatePart::GetFunction<timestamp_t>(LogicalType::TIMESTAMP));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_t>(LogicalType::TIME));
	date_part.AddFunction(StructDatePart::GetFunction<interval_t>(LogicalType::INTERVAL));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_tz_t>(LogicalType::TIME_TZ));

	for (auto &func : date_part.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return date_part;
}